

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

time_t __thiscall pstore::file::file_handle::latest_time(file_handle *this)

{
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  stat buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  stat local_a8;
  
  memset(&local_a8,0,0x90);
  iVar2 = stat((this->path_)._M_dataplus._M_p,&local_a8);
  if (iVar2 == 0) {
    if (local_a8.st_mtim.tv_sec < local_a8.st_atim.tv_sec) {
      local_a8.st_mtim.tv_sec = local_a8.st_atim.tv_sec;
    }
    if (local_a8.st_mtim.tv_sec < local_a8.st_ctim.tv_sec) {
      local_a8.st_mtim.tv_sec = local_a8.st_ctim.tv_sec;
    }
    return local_a8.st_mtim.tv_sec;
  }
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar1 = (this->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + (this->path_)._M_string_length);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (iVar2,"stat failed",&local_c8);
}

Assistant:

std::time_t file_handle::latest_time () const {
            struct stat buf {};
            if (::stat (path_.c_str (), &buf) != 0) {
                int const err = errno;
                raise_file_error (err, "stat failed", path_);
            }
/// The time members of struct stat might be called st_Xtimespec (of type struct timespec) or
/// st_Xtime (and be of type time_t). This macro is defined in the former situation.
#    ifdef PSTORE_STAT_TIMESPEC
            auto compare = [] (struct timespec const & lhs, struct timespec const & rhs) {
                return std::make_pair (lhs.tv_sec, lhs.tv_nsec) <
                       std::make_pair (rhs.tv_sec, rhs.tv_nsec);
            };
            auto const t =
                std::max ({buf.st_atimespec, buf.st_mtimespec, buf.st_ctimespec}, compare);
            constexpr auto nano = 1000000000;
            return t.tv_sec + (t.tv_nsec + (nano / 2)) / nano;
#    else
            return std::max ({buf.st_atime, buf.st_mtime, buf.st_ctime});
#    endif
        }